

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

uint64_t filemgr_update_header(filemgr *file,void *buf,size_t len,bool inc_revnum)

{
  void *__dest;
  uint64_t uVar1;
  
  pthread_spin_lock(&file->lock);
  __dest = (file->header).data;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)file->blocksize);
    (file->header).data = __dest;
  }
  memcpy(__dest,buf,len);
  (file->header).size = (filemgr_header_len_t)len;
  uVar1 = (file->header).revnum;
  if (inc_revnum) {
    uVar1 = uVar1 + 1;
    (file->header).revnum = uVar1;
  }
  pthread_spin_unlock(&file->lock);
  return uVar1;
}

Assistant:

uint64_t filemgr_update_header(struct filemgr *file,
                               void *buf,
                               size_t len,
                               bool inc_revnum)
{
    uint64_t ret;

    spin_lock(&file->lock);

    if (file->header.data == NULL) {
        file->header.data = (void *)malloc(file->blocksize);
    }
    memcpy(file->header.data, buf, len);
    file->header.size = len;
    if (inc_revnum) {
        ++(file->header.revnum);
    }
    ret = file->header.revnum;

    spin_unlock(&file->lock);

    return ret;
}